

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestStackRealloc.cpp
# Opt level: O2

void __thiscall TestEval::~TestEval(TestEval *this)

{
  operator_delete(this,0x10);
  return;
}

Assistant:

virtual void Run()
	{
		nullcTerminate();
		nullcInit();
		nullcAddImportPath(MODULE_PATH_A);
		nullcAddImportPath(MODULE_PATH_B);
		nullcSetFileReadHandler(Tests::fileLoadFunc, Tests::fileFreeFunc);
		nullcSetEnableLogFiles(Tests::enableLogFiles, Tests::openStreamFunc, Tests::writeStreamFunc, Tests::closeStreamFunc);
		nullcSetEnableTimeTrace(Tests::enableTimeTrace);
		nullcInitDynamicModule();

		const char	*testEval =
"import std.dynamic;\r\n\
\r\n\
int a = 5;\r\n\
\r\n\
for(int i = 0; i < 200; i++)\r\n\
	eval(\"a += 3 * \" + i.str() + \";\");\r\n\
\r\n\
return a;";
		double evalStart = myGetPreciseTime();
		for(int t = 0; t < TEST_TARGET_COUNT; t++)
		{
			if(!Tests::testExecutor[t])
				continue;
			testsCount[t]++;
			if(Tests::RunCodeSimple(testEval, testTarget[t], "59705", "Dynamic code. eval() [skip_c]", false, ""))
				testsPassed[t]++;
			printf("Eval test finished in %f\n", myGetPreciseTime() - evalStart);
		}
		nullcTerminate();
		nullcInit();
		nullcAddImportPath(MODULE_PATH_A);
		nullcAddImportPath(MODULE_PATH_B);
		nullcSetFileReadHandler(Tests::fileLoadFunc, Tests::fileFreeFunc);
		nullcSetEnableLogFiles(Tests::enableLogFiles, Tests::openStreamFunc, Tests::writeStreamFunc, Tests::closeStreamFunc);
		nullcSetEnableTimeTrace(Tests::enableTimeTrace);
		nullcInitDynamicModule();
	}